

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cc
# Opt level: O2

bool __thiscall absl::lts_20240722::Barrier::Block(Barrier *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  MutexLock l;
  Condition local_28;
  
  l.mu_ = (Mutex *)this;
  Mutex::Lock((Mutex *)this);
  iVar2 = *(int *)(this + 8);
  uVar1 = iVar2 - 1;
  *(uint *)(this + 8) = uVar1;
  if (iVar2 < 1) {
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"barrier.cc",0x24,
               "Block() called too many times.  num_to_block_=%d out of total=%d",(ulong)uVar1,
               (ulong)*(uint *)(this + 0xc));
    uVar1 = 0x24;
  }
  else {
    Condition::Condition(&local_28,IsZero,this + 8);
    Mutex::Await((Mutex *)this,&local_28);
    iVar3 = *(int *)(this + 0xc);
    iVar2 = iVar3 + -1;
    *(int *)(this + 0xc) = iVar2;
    if (0 < iVar3) {
      MutexLock::~MutexLock(&l);
      return iVar2 == 0;
    }
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"barrier.cc",0x2b,"Check %s failed: %s","this->num_to_exit_ >= 0",
               "barrier underflow");
    uVar1 = 0x2b;
  }
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/barrier.cc"
                ,uVar1,"bool absl::Barrier::Block()");
}

Assistant:

bool Barrier::Block() {
  MutexLock l(&this->lock_);

  this->num_to_block_--;
  if (this->num_to_block_ < 0) {
    ABSL_RAW_LOG(
        FATAL,
        "Block() called too many times.  num_to_block_=%d out of total=%d",
        this->num_to_block_, this->num_to_exit_);
  }

  this->lock_.Await(Condition(IsZero, &this->num_to_block_));

  // Determine which thread can safely delete this Barrier object
  this->num_to_exit_--;
  ABSL_RAW_CHECK(this->num_to_exit_ >= 0, "barrier underflow");

  // If num_to_exit_ == 0 then all other threads in the barrier have
  // exited the Wait() and have released the Mutex so this thread is
  // free to delete the barrier.
  return this->num_to_exit_ == 0;
}